

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

wchar_t average_spell_stat(player *p,player_state_conflict *state)

{
  magic_realm *pmVar1;
  undefined8 in_RAX;
  magic_realm *p_00;
  int iVar2;
  int iVar3;
  wchar_t count;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  p_00 = class_magic_realms(p->class,(int *)((long)&uStack_28 + 4));
  if (uStack_28._4_4_ < 1) {
    iVar2 = -1;
  }
  else {
    iVar3 = uStack_28._4_4_ + 1;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + state->stat_ind[p_00->stat];
      pmVar1 = p_00->next;
      mem_free(p_00);
      iVar3 = iVar3 + -1;
      p_00 = pmVar1;
    } while (1 < iVar3);
    iVar2 = iVar2 + -1;
  }
  return (iVar2 + uStack_28._4_4_) / uStack_28._4_4_;
}

Assistant:

static int average_spell_stat(struct player *p, struct player_state *state)
{
	int i, count, sum = 0;
	struct magic_realm *realm = class_magic_realms(p->class, &count), *r_next;

	for (i = count; i > 0; i--) {
		sum += state->stat_ind[realm->stat];
		r_next = realm->next;
		mem_free(realm);
		realm = r_next;
	}
	return (sum + count - 1) / count;
}